

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ProceduralBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::ProceduralBlockSyntax_const&>
          (BumpAllocator *this,ProceduralBlockSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ProceduralBlockSyntax *pPVar8;
  
  pPVar8 = (ProceduralBlockSyntax *)allocate(this,0x68,8);
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pPVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pPVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00593170;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pPVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pPVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00593670;
  (pPVar8->statement).ptr = (args->statement).ptr;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pPVar8->keyword).kind = (args->keyword).kind;
  (pPVar8->keyword).field_0x2 = uVar5;
  (pPVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->keyword).rawLen = uVar7;
  (pPVar8->keyword).info = pIVar3;
  return pPVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }